

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxlen.cc
# Opt level: O3

void __thiscall re2c::Node::calc_dist(Node *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  byte bVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (this->dist == 0xffffffff) {
    bVar2 = end(this);
    if (bVar2) {
      this->dist = 0;
    }
    else {
      bVar3 = this->loop;
      if (bVar3 < 2) {
        this->loop = bVar3 + 1;
        p_Var4 = (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->arcs)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var4 != p_Var1) {
          do {
            calc_dist(*(Node **)(p_Var4 + 1));
            uVar7 = *(uint *)(*(long *)(p_Var4 + 1) + 0x70);
            if (uVar7 != 0xffffffff) {
              uVar5 = this->dist;
              uVar6 = uVar7;
              if (uVar7 < uVar5) {
                uVar6 = uVar5;
              }
              if (uVar5 == 0xffffffff) {
                uVar6 = uVar7;
              }
              this->dist = uVar6;
            }
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
          } while ((_Rb_tree_header *)p_Var4 != p_Var1);
          bVar3 = this->loop - 1;
        }
        uVar5 = this->dist + 1;
        uVar7 = 0xfffffffe;
        if (uVar5 < 0xfffffffe) {
          uVar7 = uVar5;
        }
        this->dist = uVar7;
        this->loop = bVar3;
      }
    }
  }
  return;
}

Assistant:

void Node::calc_dist ()
{
	if (dist != DIST_ERROR)
	{
		return;
	}
	else if (end ())
	{
		dist = 0;
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcs_t::iterator i = arcs.begin (); i != arcs.end (); ++i)
		{
			i->first->calc_dist ();
			if (i->first->dist != DIST_ERROR)
			{
				if (dist == DIST_ERROR)
				{
					dist = i->first->dist;
				}
				else
				{
					dist = std::max (dist, i->first->dist);
				}
			}
		}
		dist = std::min (dist + 1, DIST_MAX);
	}
}